

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  Snapshot *this_00;
  bool bVar1;
  ostream *os;
  char *pcVar2;
  string local_a8;
  cmListFileContext lfc;
  cmOutputConverter converter;
  
  this_00 = &this->Snapshot;
  bVar1 = cmState::Snapshot::IsValid(this_00);
  if (bVar1) {
    cmOutputConverter::cmOutputConverter(&converter,*this_00);
    cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&local_a8,this_00);
    cmListFileContext::FromCommandContext(&lfc,&this->Context,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cmOutputConverter::Convert(&local_a8,&converter,&lfc.FilePath,HOME,UNCHANGED);
    std::__cxx11::string::operator=((string *)&lfc.FilePath,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar2 = " at ";
    if (lfc.Line == 0) {
      pcVar2 = " in ";
    }
    os = std::operator<<(out,pcVar2);
    operator<<(os,&lfc);
    cmListFileContext::~cmListFileContext(&lfc);
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  if (!this->Snapshot.IsValid())
    {
    return;
    }
  cmOutputConverter converter(this->Snapshot);
  cmListFileContext lfc =
      cmListFileContext::FromCommandContext(
        this->Context, this->Snapshot.GetExecutionListFile());
  lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
  out << (lfc.Line ? " at " : " in ") << lfc;
}